

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O0

void __thiscall Polymer::Initialize(Polymer *this)

{
  pointer *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  reference pIVar4;
  reference pIVar5;
  SpeciesTracker *pSVar6;
  FixedElement *pFVar7;
  string *psVar8;
  enable_shared_from_this<Polymer> local_138;
  reference local_128;
  Interval<std::shared_ptr<BindingSite>,_unsigned_long> *interval_2;
  iterator __end1_2;
  iterator __begin1_2;
  vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  *__range1_2;
  Interval<std::shared_ptr<ReleaseSite>,_unsigned_long> *interval_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
  *__range1_1;
  vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
  term_results;
  Interval<std::shared_ptr<BindingSite>,_unsigned_long> *interval;
  iterator __end1;
  iterator __begin1;
  vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  *__range1;
  int mask_stop;
  int mask_start;
  vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  results;
  IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long> local_40;
  Polymer *local_10;
  Polymer *this_local;
  
  local_10 = this;
  IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>::IntervalTree
            (&local_40,&this->binding_intervals_,0x10,0x40,0,0,0x200);
  IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>::operator=
            (&this->binding_sites_,&local_40);
  IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>::~IntervalTree(&local_40);
  this_00 = &results.
             super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>::IntervalTree
            ((IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long> *)this_00,
             &this->release_intervals_,0x10,0x40,0,0,0x200);
  IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>::operator=
            (&this->release_sites_,(intervalTree *)this_00);
  IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>::~IntervalTree
            ((IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long> *)
             &results.
              super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ::vector((vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
            *)&mask_stop);
  iVar2 = MobileElement::start(&(this->mask_).super_MobileElement);
  iVar3 = MobileElement::stop(&(this->mask_).super_MobileElement);
  IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>::findOverlapping
            (&this->binding_sites_,(long)iVar2,(long)iVar3,(intervalVector *)&mask_stop);
  __end1 = std::
           vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
           ::begin((vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                    *)&mask_stop);
  interval = (Interval<std::shared_ptr<BindingSite>,_unsigned_long> *)
             std::
             vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
             ::end((vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                    *)&mask_stop);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_*,_std::vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>_>
                                *)&interval);
    if (!bVar1) break;
    pIVar4 = __gnu_cxx::
             __normal_iterator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_*,_std::vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>_>
             ::operator*(&__end1);
    pSVar6 = SpeciesTracker::Instance();
    pFVar7 = &std::__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&pIVar4->value)->super_FixedElement;
    psVar8 = FixedElement::name_abi_cxx11_(pFVar7);
    std::enable_shared_from_this<Polymer>::shared_from_this
              ((enable_shared_from_this<Polymer> *)
               &term_results.
                super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    SpeciesTracker::Add(pSVar6,psVar8,
                        (Ptr *)&term_results.
                                super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::shared_ptr<Polymer>::~shared_ptr
              ((shared_ptr<Polymer> *)
               &term_results.
                super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pFVar7 = &std::__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&pIVar4->value)->super_FixedElement;
    FixedElement::Cover(pFVar7);
    pFVar7 = &std::__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&pIVar4->value)->super_FixedElement;
    FixedElement::ResetState(pFVar7);
    __gnu_cxx::
    __normal_iterator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_*,_std::vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>_>
    ::operator++(&__end1);
  }
  std::
  vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
  ::vector((vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
            *)&__range1_1);
  IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>::findOverlapping
            (&this->release_sites_,(long)iVar2,(long)iVar3,
             (vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
              *)&__range1_1);
  __end1_1 = std::
             vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
             ::begin((vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
                      *)&__range1_1);
  interval_1 = (Interval<std::shared_ptr<ReleaseSite>,_unsigned_long> *)
               std::
               vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
               ::end((vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
                      *)&__range1_1);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_*,_std::vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>_>
                        *)&interval_1);
    if (!bVar1) break;
    pIVar5 = __gnu_cxx::
             __normal_iterator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_*,_std::vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>_>
             ::operator*(&__end1_1);
    pFVar7 = &std::__shared_ptr_access<ReleaseSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<ReleaseSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&pIVar5->value)->super_FixedElement;
    FixedElement::Cover(pFVar7);
    pFVar7 = &std::__shared_ptr_access<ReleaseSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<ReleaseSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&pIVar5->value)->super_FixedElement;
    FixedElement::ResetState(pFVar7);
    __gnu_cxx::
    __normal_iterator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_*,_std::vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>_>
    ::operator++(&__end1_1);
  }
  std::
  vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ::clear((vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
           *)&mask_stop);
  this->total_elements_ = 0;
  this->degraded_elements_ = 0;
  IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>::findContained
            (&this->binding_sites_,(long)this->start_,(long)iVar2,
             (vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
              *)&mask_stop);
  __end1_2 = std::
             vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
             ::begin((vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                      *)&mask_stop);
  interval_2 = (Interval<std::shared_ptr<BindingSite>,_unsigned_long> *)
               std::
               vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
               ::end((vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                      *)&mask_stop);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_2,
                       (__normal_iterator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_*,_std::vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>_>
                        *)&interval_2);
    if (!bVar1) break;
    local_128 = __gnu_cxx::
                __normal_iterator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_*,_std::vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>_>
                ::operator*(&__end1_2);
    pSVar6 = SpeciesTracker::Instance();
    pFVar7 = &std::__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&local_128->value)->super_FixedElement;
    psVar8 = FixedElement::name_abi_cxx11_(pFVar7);
    std::enable_shared_from_this<Polymer>::shared_from_this(&local_138);
    SpeciesTracker::Add(pSVar6,psVar8,(Ptr *)&local_138);
    std::shared_ptr<Polymer>::~shared_ptr((shared_ptr<Polymer> *)&local_138);
    pFVar7 = &std::__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&local_128->value)->super_FixedElement;
    FixedElement::Uncover(pFVar7);
    pFVar7 = &std::__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&local_128->value)->super_FixedElement;
    FixedElement::ResetState(pFVar7);
    pFVar7 = &std::__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&local_128->value)->super_FixedElement;
    psVar8 = FixedElement::name_abi_cxx11_(pFVar7);
    LogUncover(this,psVar8);
    this->total_elements_ = this->total_elements_ + 1;
    __gnu_cxx::
    __normal_iterator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_*,_std::vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>_>
    ::operator++(&__end1_2);
  }
  std::
  vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
  ::~vector((vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
             *)&__range1_1);
  std::
  vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ::~vector((vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
             *)&mask_stop);
  return;
}

Assistant:

void Polymer::Initialize() {
  // Construct invterval trees
  binding_sites_ = IntervalTree<BindingSite::Ptr>(binding_intervals_);
  release_sites_ = IntervalTree<ReleaseSite::Ptr>(release_intervals_);
  std::vector<Interval<BindingSite::Ptr>> results;

  // Cover all masked sites
  int mask_start = mask_.start();
  int mask_stop = mask_.stop();
  binding_sites_.findOverlapping(mask_start, mask_stop, results);

  for (auto &interval : results) {
    // TODO: move to wrapper reaction
    SpeciesTracker::Instance().Add(interval.value->name(), shared_from_this());
    interval.value->Cover();
    interval.value->ResetState();
    // We don't need to log anything here because covered promoters are
    // invisible to SpeciesTracker.
  }

  std::vector<Interval<ReleaseSite::Ptr>> term_results;
  release_sites_.findOverlapping(mask_start, mask_stop, term_results);

  for (auto &interval : term_results) {
    interval.value->Cover();
    interval.value->ResetState();
  }

  // Make sure all unmasked sites are uncovered
  results.clear();
  total_elements_ = 0;
  degraded_elements_ = 0;
  binding_sites_.findContained(start_, mask_start, results);
  for (auto &interval : results) {
    // TODO: Move to bridge reaction
    SpeciesTracker::Instance().Add(interval.value->name(), shared_from_this());
    interval.value->Uncover();
    interval.value->ResetState();
    LogUncover(interval.value->name());
    total_elements_ += 1;
  }

  // for (auto elem : uncovered_) {
  //  std::cout << elem.first + " " + std::to_string(elem.second) << std::endl;
  // }
}